

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O3

void __thiscall validation_tests::block_malleation::test_method(block_malleation *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint256 commitment;
  uint256 commitment_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  pointer psVar11;
  pointer psVar12;
  bool bVar13;
  readonly_property65 rVar14;
  CBlock *pCVar15;
  iterator in_R8;
  iterator pvVar16;
  iterator in_R9;
  iterator pvVar17;
  pointer psVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  uint256 merkle_root;
  CMutableTransaction tx3;
  HashWriter hasher_1;
  HashWriter hasher;
  HashWriter hasher_2;
  check_type cVar27;
  check_type cVar28;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  assertion_result local_520;
  char **local_508;
  assertion_result local_500;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_1f0;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [8];
  shared_count asStack_1c8 [3];
  undefined1 local_1b0 [16];
  shared_count sStack_1a0;
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_198;
  undefined1 local_178 [8];
  bool abStack_170 [8];
  shared_count sStack_168;
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_160 [3];
  undefined1 local_110 [8];
  bool bStack_108;
  uchar uStack_107;
  uchar uStack_106;
  uchar uStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  uchar uStack_101;
  undefined8 local_100;
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_f8 [3];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  uchar local_88 [4];
  readonly_property<bool> rStack_84;
  uchar uStack_83;
  uchar uStack_82;
  uchar uStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  undefined1 auStack_70 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_58;
  undefined2 uStack_40;
  bool bStack_3e;
  long local_38;
  
  sStack_1f0.pn.pi_ = (sp_counted_base *)sStack_1f0.px;
  asStack_1c8[0].pi_ = (sp_counted_base *)auStack_1d0;
  sStack_1a0.pi_ = (sp_counted_base *)local_1b0._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = '\0';
  auStack_70[8] = '\0';
  auStack_70[9] = '\0';
  auStack_70[10] = '\0';
  auStack_70[0xb] = '\0';
  auStack_70._12_12_ = SUB1612((undefined1  [16])0x0,4);
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  auStack_70[0] = '\0';
  auStack_70[1] = '\0';
  auStack_70[2] = '\0';
  auStack_70[3] = '\0';
  auStack_70[4] = '\0';
  auStack_70[5] = '\0';
  auStack_70[6] = '\0';
  auStack_70[7] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  rStack_84.super_class_property<bool>.value = (class_property<bool>)false;
  uStack_83 = '\0';
  uStack_82 = '\0';
  uStack_81 = '\0';
  uStack_80 = '\0';
  uStack_7f = '\0';
  uStack_7e = '\0';
  uStack_7d = '\0';
  uStack_7c = '\0';
  uStack_7b = '\0';
  uStack_7a = '\0';
  uStack_79 = '\0';
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  local_a8 = (undefined1  [16])0x0;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xd0;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  local_178[0] = (class_property<bool>)
                 (local_58.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                 (pointer)CONCAT53(local_58.
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                                   local_58.
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_3_));
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "block.vtx.empty()";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_220 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_228,0xd0);
  boost::detail::shared_count::~shared_count(&sStack_168);
  uStack_83 = '\0';
  uStack_82 = '\0';
  uStack_81 = '\0';
  uStack_80 = '\0';
  uStack_7f = '\0';
  uStack_7e = '\0';
  uStack_7d = '\0';
  uStack_7c = '\0';
  uStack_7b = '\0';
  uStack_7a = '\0';
  uStack_79 = '\0';
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  auStack_70[0] = '\0';
  auStack_70[1] = '\0';
  auStack_70[2] = '\0';
  auStack_70[3] = '\0';
  auStack_70[4] = '\0';
  auStack_70[5] = '\0';
  auStack_70[6] = '\0';
  auStack_70[7] = '\0';
  auStack_70[8] = '\0';
  auStack_70[9] = '\0';
  auStack_70[10] = '\0';
  auStack_70[0xb] = '\0';
  rStack_84.super_class_property<bool>.value = (class_property<bool>)true;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xd2;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar17;
  msg_00.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, false)";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_250 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_258,0xd2);
  boost::detail::shared_count::~shared_count(&sStack_168);
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  auStack_70[0] = '\0';
  auStack_70[1] = '\0';
  auStack_70[2] = '\0';
  auStack_70[3] = '\0';
  auStack_70[4] = '\0';
  auStack_70[5] = '\0';
  auStack_70[6] = '\0';
  auStack_70[7] = '\0';
  auStack_70[8] = '\0';
  auStack_70[9] = '\0';
  auStack_70[10] = '\0';
  auStack_70[0xb] = '\0';
  rStack_84.super_class_property<bool>.value = (class_property<bool>)false;
  uStack_83 = '\0';
  uStack_82 = '\0';
  uStack_81 = '\0';
  uStack_80 = '\0';
  uStack_7f = '\0';
  uStack_7e = '\0';
  uStack_7d = '\0';
  uStack_7c = '\0';
  uStack_7b = '\0';
  uStack_7a = '\0';
  uStack_79 = '\0';
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xd4;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = pvVar17;
  msg_01.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  bVar13 = IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_178[0] = (class_property<bool>)!bVar13;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_not_mutated(block, false)";
  local_1b0._8_8_ = (element_type *)0xf802f6;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_280 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_288,0xd4);
  boost::detail::shared_count::~shared_count(&sStack_168);
  test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_110,false);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_110);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT17(uStack_101,
                    CONCAT16(uStack_102,
                             CONCAT15(uStack_103,
                                      CONCAT14(uStack_104,
                                               CONCAT13(uStack_105,
                                                        CONCAT12(uStack_106,
                                                                 CONCAT11(uStack_107,bStack_108)))))
                            ));
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xd9;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = pvVar17;
  msg_02.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  peVar1 = ((local_58.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  auVar22 = *(undefined1 (*) [16])
             ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar24[0] = -(rStack_84.super_class_property<bool>.value ==
                (class_property<bool>)
                (peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar24[1] = -(uStack_83 ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 1)
                );
  auVar24[2] = -(uStack_82 ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 2)
                );
  auVar24[3] = -(uStack_81 ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 3)
                );
  auVar24[4] = -(uStack_80 ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4)
                );
  auVar24[5] = -(uStack_7f ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 5)
                );
  auVar24[6] = -(uStack_7e ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 6)
                );
  auVar24[7] = -(uStack_7d ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 7)
                );
  auVar24[8] = -(uStack_7c ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                );
  auVar24[9] = -(uStack_7b ==
                *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 9)
                );
  auVar24[10] = -(uStack_7a ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           10));
  auVar24[0xb] = -(uStack_79 ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xb));
  auVar24[0xc] = -(local_78 ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xc));
  auVar24[0xd] = -(uStack_77 ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xd));
  auVar24[0xe] = -(uStack_76 ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xe));
  auVar24[0xf] = -(uStack_75 ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xf));
  auVar19[0] = -(uStack_74 == auVar22[0]);
  auVar19[1] = -(uStack_73 == auVar22[1]);
  auVar19[2] = -(uStack_72 == auVar22[2]);
  auVar19[3] = -(uStack_71 == auVar22[3]);
  auVar19[4] = -(auStack_70[0] == auVar22[4]);
  auVar19[5] = -(auStack_70[1] == auVar22[5]);
  auVar19[6] = -(auStack_70[2] == auVar22[6]);
  auVar19[7] = -(auStack_70[3] == auVar22[7]);
  auVar19[8] = -(auStack_70[4] == auVar22[8]);
  auVar19[9] = -(auStack_70[5] == auVar22[9]);
  auVar19[10] = -(auStack_70[6] == auVar22[10]);
  auVar19[0xb] = -(auStack_70[7] == auVar22[0xb]);
  auVar19[0xc] = -(auStack_70[8] == auVar22[0xc]);
  auVar19[0xd] = -(auStack_70[9] == auVar22[0xd]);
  auVar19[0xe] = -(auStack_70[10] == auVar22[0xe]);
  auVar19[0xf] = -(auStack_70[0xb] == auVar22[0xf]);
  auVar19 = auVar19 & auVar24;
  local_178[0] = (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff);
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "block.vtx[0]->GetHash() != block.hashMerkleRoot";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2b0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_2b8,0xd9);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xda;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar17;
  msg_03.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, false)";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2e0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_2e8,0xda);
  boost::detail::shared_count::~shared_count(&sStack_168);
  peVar1 = ((local_58.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  uStack_74 = (uchar)uVar8;
  uStack_73 = (uchar)((ulong)uVar8 >> 8);
  uStack_72 = (uchar)((ulong)uVar8 >> 0x10);
  uStack_71 = (uchar)((ulong)uVar8 >> 0x18);
  auStack_70[0] = (undefined1)((ulong)uVar8 >> 0x20);
  auStack_70[1] = (undefined1)((ulong)uVar8 >> 0x28);
  auStack_70[2] = (undefined1)((ulong)uVar8 >> 0x30);
  auStack_70[3] = (undefined1)((ulong)uVar8 >> 0x38);
  auStack_70[4] = (undefined1)uVar9;
  auStack_70[5] = (undefined1)((ulong)uVar9 >> 8);
  auStack_70[6] = (undefined1)((ulong)uVar9 >> 0x10);
  auStack_70[7] = (undefined1)((ulong)uVar9 >> 0x18);
  auStack_70[8] = (undefined1)((ulong)uVar9 >> 0x20);
  auStack_70[9] = (undefined1)((ulong)uVar9 >> 0x28);
  auStack_70[10] = (undefined1)((ulong)uVar9 >> 0x30);
  auStack_70[0xb] = (undefined1)((ulong)uVar9 >> 0x38);
  rStack_84.super_class_property<bool>.value = SUB81(uVar6,0);
  uStack_83 = (uchar)((ulong)uVar6 >> 8);
  uStack_82 = (uchar)((ulong)uVar6 >> 0x10);
  uStack_81 = (uchar)((ulong)uVar6 >> 0x18);
  uStack_80 = (uchar)((ulong)uVar6 >> 0x20);
  uStack_7f = (uchar)((ulong)uVar6 >> 0x28);
  uStack_7e = (uchar)((ulong)uVar6 >> 0x30);
  uStack_7d = (uchar)((ulong)uVar6 >> 0x38);
  uStack_7c = (uchar)uVar7;
  uStack_7b = (uchar)((ulong)uVar7 >> 8);
  uStack_7a = (uchar)((ulong)uVar7 >> 0x10);
  uStack_79 = (uchar)((ulong)uVar7 >> 0x18);
  local_78 = (uchar)((ulong)uVar7 >> 0x20);
  uStack_77 = (uchar)((ulong)uVar7 >> 0x28);
  uStack_76 = (uchar)((ulong)uVar7 >> 0x30);
  uStack_75 = (uchar)((ulong)uVar7 >> 0x38);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xdc;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar17;
  msg_04.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  bVar13 = IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_178[0] = (class_property<bool>)!bVar13;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_not_mutated(block, false)";
  local_1b0._8_8_ = (element_type *)0xf802f6;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_310 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_318,0xdc);
  boost::detail::shared_count::~shared_count(&sStack_168);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_110);
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_170,(CTransaction **)local_178,
             (allocator<CTransaction> *)local_1b0,(CMutableTransaction *)local_110);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(abStack_170._1_7_,abStack_170[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(abStack_170._1_7_,abStack_170[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xe2;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = pvVar17;
  msg_05.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, false)";
  local_1b0._8_8_ = (element_type *)0xf802d9;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_340 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_348,0xe2);
  boost::detail::shared_count::~shared_count(&sStack_168);
  CSHA256::CSHA256((CSHA256 *)local_110);
  CSHA256::Write((CSHA256 *)local_110,
                 (uchar *)&(((local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash,0x20);
  CSHA256::Write((CSHA256 *)local_110,
                 (uchar *)&(local_58.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash,0x20);
  HashWriter::GetHash((uint256 *)local_178,(HashWriter *)local_110);
  uStack_74 = (uchar)sStack_168.pi_;
  uStack_73 = (uchar)((ulong)sStack_168.pi_ >> 8);
  uStack_72 = (uchar)((ulong)sStack_168.pi_ >> 0x10);
  uStack_71 = (uchar)((ulong)sStack_168.pi_ >> 0x18);
  auStack_70[0] = (undefined1)((ulong)sStack_168.pi_ >> 0x20);
  auStack_70[1] = (undefined1)((ulong)sStack_168.pi_ >> 0x28);
  auStack_70[2] = (undefined1)((ulong)sStack_168.pi_ >> 0x30);
  auStack_70[3] = (undefined1)((ulong)sStack_168.pi_ >> 0x38);
  auStack_70[4] =
       SUB81(avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = local_178[0];
  uStack_83 = (uchar)local_178._1_7_;
  uStack_82 = SUB71(local_178._1_7_,1);
  uStack_81 = SUB71(local_178._1_7_,2);
  uStack_80 = SUB71(local_178._1_7_,3);
  uStack_7f = SUB71(local_178._1_7_,4);
  uStack_7e = SUB71(local_178._1_7_,5);
  uStack_7d = SUB71(local_178._1_7_,6);
  uStack_7c = abStack_170[0];
  uStack_7b = (uchar)abStack_170._1_7_;
  uStack_7a = SUB71(abStack_170._1_7_,1);
  uStack_79 = SUB71(abStack_170._1_7_,2);
  local_78 = SUB71(abStack_170._1_7_,3);
  uStack_77 = SUB71(abStack_170._1_7_,4);
  uStack_76 = SUB71(abStack_170._1_7_,5);
  uStack_75 = SUB71(abStack_170._1_7_,6);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xe7;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = pvVar17;
  msg_06.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  bVar13 = IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_1b0[0] = (class_property<bool>)(class_property<bool>)!bVar13;
  local_1b0._8_8_ = (element_type *)0x0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1d8;
  local_1d8 = (undefined1  [8])0xf802da;
  auStack_1d0 = (undefined1  [8])(element_type *)0xf802f6;
  abStack_170[0] = false;
  local_178[0] = (class_property<bool>)0xc8;
  local_178._1_7_ = 0x13ae1;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_370 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)local_178,1,0,WARN,_cVar27,
             (size_t)&local_378,0xe7);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((local_58.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_58.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &((local_58.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  CSHA256::CSHA256((CSHA256 *)local_178);
  CSHA256::Write((CSHA256 *)local_178,
                 (uchar *)&(((local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash,0x20);
  CSHA256::Write((CSHA256 *)local_178,
                 (uchar *)&(local_58.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash,0x20);
  HashWriter::GetHash((uint256 *)local_1b0,(HashWriter *)local_178);
  uStack_74 = local_1b0[0x10];
  uStack_73 = local_1b0[0x11];
  uStack_72 = local_1b0[0x12];
  uStack_71 = local_1b0[0x13];
  auStack_70[0] = local_1b0[0x14];
  auStack_70[1] = local_1b0[0x15];
  auStack_70[2] = local_1b0[0x16];
  auStack_70[3] = local_1b0[0x17];
  auStack_70[4] =
       SUB81(vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = SUB81(local_1b0._0_8_,0);
  uStack_83 = SUB81(local_1b0._0_8_,1);
  uStack_82 = SUB81(local_1b0._0_8_,2);
  uStack_81 = SUB81(local_1b0._0_8_,3);
  uStack_80 = SUB81(local_1b0._0_8_,4);
  uStack_7f = SUB81(local_1b0._0_8_,5);
  uStack_7e = SUB81(local_1b0._0_8_,6);
  uStack_7d = SUB81(local_1b0._0_8_,7);
  uStack_7c = local_1b0[8];
  uStack_7b = local_1b0[9];
  uStack_7a = local_1b0[10];
  uStack_79 = local_1b0[0xb];
  local_78 = local_1b0[0xc];
  uStack_77 = local_1b0[0xd];
  uStack_76 = local_1b0[0xe];
  uStack_75 = local_1b0[0xf];
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xf0;
  file_07.m_begin = (iterator)&local_388;
  msg_07.m_end = pvVar17;
  msg_07.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  rVar14.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_1d8[0] = rVar14.super_readonly_property<bool>.super_class_property<bool>.value;
  auStack_1d0 = (undefined1  [8])0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  local_1f8 = (undefined1  [8])0xf802c1;
  sStack_1f0.px = (element_type *)0xf802d9;
  local_1b0._8_8_ = local_1b0._9_8_ << 8;
  local_1b0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  sStack_1a0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3a0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1b0,1,0,WARN,_cVar27,
             (size_t)&local_3a8,0xf0);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1d0 + 8));
  psVar12 = local_58.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (pointer)CONCAT53(local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                              local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_3_);
  psVar18 = local_58.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar11 !=
      local_58.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var2 = (psVar18->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar11);
    local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_3_ = SUB83(psVar12,0);
    local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._3_5_ = (undefined5)((ulong)psVar12 >> 0x18);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_178);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(avStack_160,1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            (&((avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,4);
  local_1b0._0_8_ = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b0 + 8),
             (CTransaction **)local_1b0,(allocator<CTransaction> *)local_1d8,
             (CMutableTransaction *)local_178);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_1b0);
  if ((element_type *)local_1b0._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
  }
  lVar3 = *(long *)(CONCAT53(local_58.
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                             local_58.
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_3_) + -0x10);
  uVar6 = *(undefined8 *)(lVar3 + 0x39);
  uVar7 = *(undefined8 *)(lVar3 + 0x41);
  uVar8 = *(undefined8 *)(lVar3 + 0x49);
  uVar9 = *(undefined8 *)(lVar3 + 0x51);
  uStack_74 = (uchar)uVar8;
  uStack_73 = (uchar)((ulong)uVar8 >> 8);
  uStack_72 = (uchar)((ulong)uVar8 >> 0x10);
  uStack_71 = (uchar)((ulong)uVar8 >> 0x18);
  auStack_70[0] = (undefined1)((ulong)uVar8 >> 0x20);
  auStack_70[1] = (undefined1)((ulong)uVar8 >> 0x28);
  auStack_70[2] = (undefined1)((ulong)uVar8 >> 0x30);
  auStack_70[3] = (undefined1)((ulong)uVar8 >> 0x38);
  auStack_70[4] = (undefined1)uVar9;
  auStack_70[5] = (undefined1)((ulong)uVar9 >> 8);
  auStack_70[6] = (undefined1)((ulong)uVar9 >> 0x10);
  auStack_70[7] = (undefined1)((ulong)uVar9 >> 0x18);
  auStack_70[8] = (undefined1)((ulong)uVar9 >> 0x20);
  auStack_70[9] = (undefined1)((ulong)uVar9 >> 0x28);
  auStack_70[10] = (undefined1)((ulong)uVar9 >> 0x30);
  auStack_70[0xb] = (undefined1)((ulong)uVar9 >> 0x38);
  rStack_84.super_class_property<bool>.value = SUB81(uVar6,0);
  uStack_83 = (uchar)((ulong)uVar6 >> 8);
  uStack_82 = (uchar)((ulong)uVar6 >> 0x10);
  uStack_81 = (uchar)((ulong)uVar6 >> 0x18);
  uStack_80 = (uchar)((ulong)uVar6 >> 0x20);
  uStack_7f = (uchar)((ulong)uVar6 >> 0x28);
  uStack_7e = (uchar)((ulong)uVar6 >> 0x30);
  uStack_7d = (uchar)((ulong)uVar6 >> 0x38);
  uStack_7c = (uchar)uVar7;
  uStack_7b = (uchar)((ulong)uVar7 >> 8);
  uStack_7a = (uchar)((ulong)uVar7 >> 0x10);
  uStack_79 = (uchar)((ulong)uVar7 >> 0x18);
  local_78 = (uchar)((ulong)uVar7 >> 0x20);
  uStack_77 = (uchar)((ulong)uVar7 >> 0x28);
  uStack_76 = (uchar)((ulong)uVar7 >> 0x30);
  uStack_75 = (uchar)((ulong)uVar7 >> 0x38);
  bVar13 = CTransaction::IsCoinBase
                     (*(CTransaction **)
                       (CONCAT53(local_58.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                                 local_58.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_3_) + -0x10));
  if (!bVar13) {
    __assert_fail("block.vtx.back()->IsCoinBase()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0xfc,"void validation_tests::block_malleation::test_method()");
  }
  local_1d8 = (undefined1  [8])0x0;
  local_1b0._0_8_ = &::TX_NO_WITNESS;
  local_1b0._8_8_ = (allocator<CTransaction> *)local_1d8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (*(CTransaction **)
              (CONCAT53(local_58.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                        local_58.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_3_) + -0x10),
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1b0,&::TX_NO_WITNESS);
  if (local_1d8 != (undefined1  [8])0x40) {
    __assert_fail("GetSerializeSize(TX_NO_WITNESS(block.vtx.back())) == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0xfd,"void validation_tests::block_malleation::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xff;
  file_08.m_begin = (iterator)&local_3b8;
  msg_08.m_end = pvVar17;
  msg_08.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
             msg_08);
  bVar13 = IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_1b0._8_8_ = (element_type *)0x0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = (undefined1  [8])0xf802da;
  auStack_1d0 = (undefined1  [8])0xf802f6;
  abStack_170[0] = false;
  local_178[0] = (class_property<bool>)0xc8;
  local_178._1_7_ = 0x13ae1;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3d0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1d8;
  local_1b0[0] = (class_property<bool>)(class_property<bool>)!bVar13;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)local_178,1,0,WARN,_cVar27,
             (size_t)&local_3d8,0xff);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_58);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_110);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x116;
  file_09.m_begin = (iterator)&local_3e8;
  msg_09.m_end = pvVar17;
  msg_09.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f8,
             msg_09);
  local_a8._0_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ff204bd0000000000000","");
  local_1b0[0] = (class_property<bool>)
                 DecodeHexTx((CMutableTransaction *)local_110,(string *)local_a8,true,false);
  local_1b0._8_8_ = (element_type *)0x0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = (undefined1  [8])0xf803ab;
  auStack_1d0 = (undefined1  [8])(element_type *)0xf803e0;
  abStack_170[0] = false;
  local_178[0] = (class_property<bool>)0xc8;
  local_178._1_7_ = 0x13ae1;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_400 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)local_178,1,0,WARN,_cVar27,
             (size_t)&local_408,0x116);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_178);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x118;
  file_10.m_begin = (iterator)&local_418;
  msg_10.m_end = pvVar17;
  msg_10.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
             msg_10);
  local_a8._0_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"8ae53c92000000000000","");
  rVar14.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       DecodeHexTx((CMutableTransaction *)local_178,(string *)local_a8,true,false);
  local_1d8[0] = rVar14.super_readonly_property<bool>.super_class_property<bool>.value;
  auStack_1d0 = (undefined1  [8])0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  local_1f8 = (undefined1  [8])0xf803f6;
  sStack_1f0.px = (element_type *)0xf8042b;
  local_1b0._8_8_ = local_1b0._9_8_ << 8;
  local_1b0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  sStack_1a0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_430 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  vStack_198.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1b0,1,0,WARN,_cVar27,
             (size_t)&local_438,0x118);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1d0 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_1b0);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x11a;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar17;
  msg_11.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  local_a8._0_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,
             "cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06"
             ,"");
  rVar14.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       DecodeHexTx((CMutableTransaction *)local_1b0,(string *)local_a8,true,false);
  local_1f8[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar14.super_readonly_property<bool>.super_class_property<bool>.value;
  sStack_1f0.px = (element_type *)0x0;
  sStack_1f0.pn.pi_ = (sp_counted_base *)0x0;
  asStack_1c8[1].pi_ = (sp_counted_base *)&local_520;
  local_520._0_8_ =
       "DecodeHexTx(tx3, \"cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06\", true, false)"
  ;
  local_520.m_message.px = (element_type *)0xf8054e;
  auStack_1d0 = (undefined1  [8])(auStack_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  asStack_1c8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_460 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar27,
             (size_t)&local_468,0x11a);
  boost::detail::shared_count::~shared_count(&sStack_1f0.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  CSHA256::CSHA256((CSHA256 *)local_a8);
  CMutableTransaction::GetHash((Txid *)local_1d8,(CMutableTransaction *)local_110);
  CSHA256::Write((CSHA256 *)local_a8,local_1d8,0x20);
  CMutableTransaction::GetHash((Txid *)local_1d8,(CMutableTransaction *)local_178);
  CSHA256::Write((CSHA256 *)local_a8,local_1d8,0x20);
  HashWriter::GetHash((uint256 *)local_1d8,(HashWriter *)local_a8);
  CMutableTransaction::GetHash((Txid *)local_1f8,(CMutableTransaction *)local_1b0);
  auVar22[0] = -((readonly_property<bool>)local_1f8[0] == local_1d8[0]);
  auVar22[1] = -(local_1f8[1] == local_1d8[1]);
  auVar22[2] = -(local_1f8[2] == local_1d8[2]);
  auVar22[3] = -(local_1f8[3] == local_1d8[3]);
  auVar22[4] = -(local_1f8[4] == local_1d8[4]);
  auVar22[5] = -(local_1f8[5] == local_1d8[5]);
  auVar22[6] = -(local_1f8[6] == local_1d8[6]);
  auVar22[7] = -(local_1f8[7] == local_1d8[7]);
  auVar22[8] = -(sStack_1f0.px._0_1_ == (bool)auStack_1d0[0]);
  auVar22[9] = -(sStack_1f0.px._1_1_ == auStack_1d0[1]);
  auVar22[10] = -(sStack_1f0.px._2_1_ == auStack_1d0[2]);
  auVar22[0xb] = -(sStack_1f0.px._3_1_ == auStack_1d0[3]);
  auVar22[0xc] = -(sStack_1f0.px._4_1_ == auStack_1d0[4]);
  auVar22[0xd] = -(sStack_1f0.px._5_1_ == auStack_1d0[5]);
  auVar22[0xe] = -(sStack_1f0.px._6_1_ == auStack_1d0[6]);
  auVar22[0xf] = -(sStack_1f0.px._7_1_ == auStack_1d0[7]);
  auVar25[0] = -((uchar)sStack_1f0.pn.pi_ == asStack_1c8[0].pi_._0_1_);
  auVar25[1] = -(sStack_1f0.pn.pi_._1_1_ == asStack_1c8[0].pi_._1_1_);
  auVar25[2] = -(sStack_1f0.pn.pi_._2_1_ == asStack_1c8[0].pi_._2_1_);
  auVar25[3] = -(sStack_1f0.pn.pi_._3_1_ == asStack_1c8[0].pi_._3_1_);
  auVar25[4] = -(sStack_1f0.pn.pi_._4_1_ == asStack_1c8[0].pi_._4_1_);
  auVar25[5] = -(sStack_1f0.pn.pi_._5_1_ == asStack_1c8[0].pi_._5_1_);
  auVar25[6] = -(sStack_1f0.pn.pi_._6_1_ == asStack_1c8[0].pi_._6_1_);
  auVar25[7] = -(sStack_1f0.pn.pi_._7_1_ == asStack_1c8[0].pi_._7_1_);
  auVar25[8] = -((uchar)uStack_1e0 == asStack_1c8[1].pi_._0_1_);
  auVar25[9] = -(uStack_1e0._1_1_ == asStack_1c8[1].pi_._1_1_);
  auVar25[10] = -(uStack_1e0._2_1_ == asStack_1c8[1].pi_._2_1_);
  auVar25[0xb] = -(uStack_1e0._3_1_ == asStack_1c8[1].pi_._3_1_);
  auVar25[0xc] = -(uStack_1e0._4_1_ == asStack_1c8[1].pi_._4_1_);
  auVar25[0xd] = -(uStack_1e0._5_1_ == asStack_1c8[1].pi_._5_1_);
  auVar25[0xe] = -(uStack_1e0._6_1_ == asStack_1c8[1].pi_._6_1_);
  auVar25[0xf] = -(uStack_1e0._7_1_ == asStack_1c8[1].pi_._7_1_);
  auVar22 = auVar22 & auVar25;
  if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("hasher.GetHash() == tx3.GetHash()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0x120,"void validation_tests::block_malleation::test_method()");
  }
  local_1f8 = (undefined1  [8])0x0;
  local_1d8 = (undefined1  [8])&::TX_NO_WITNESS;
  auStack_1d0 = (undefined1  [8])local_1f8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CMutableTransaction>
            ((CMutableTransaction *)local_1b0,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_1d8,&::TX_NO_WITNESS);
  if (local_1f8 != (undefined1  [8])0x40) {
    __assert_fail("GetSerializeSize(TX_NO_WITNESS(tx3)) == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0x122,"void validation_tests::block_malleation::test_method()");
  }
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = '\0';
  auStack_70[8] = '\0';
  auStack_70[9] = '\0';
  auStack_70[10] = '\0';
  auStack_70[0xb] = '\0';
  auStack_70._12_12_ = SUB1612((undefined1  [16])0x0,4);
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  auStack_70[0] = '\0';
  auStack_70[1] = '\0';
  auStack_70[2] = '\0';
  auStack_70[3] = '\0';
  auStack_70[4] = '\0';
  auStack_70[5] = '\0';
  auStack_70[6] = '\0';
  auStack_70[7] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  rStack_84.super_class_property<bool>.value = (class_property<bool>)false;
  uStack_83 = '\0';
  uStack_82 = '\0';
  uStack_81 = '\0';
  uStack_80 = '\0';
  uStack_7f = '\0';
  uStack_7e = '\0';
  uStack_7d = '\0';
  uStack_7c = '\0';
  uStack_7b = '\0';
  uStack_7a = '\0';
  uStack_79 = '\0';
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  local_a8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0,(CTransaction **)local_1d8,
             (allocator<CTransaction> *)local_1f8,(CMutableTransaction *)local_110);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_1d8);
  if (auStack_1d0 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0);
  }
  local_1d8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0,(CTransaction **)local_1d8,
             (allocator<CTransaction> *)local_1f8,(CMutableTransaction *)local_178);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_1d8);
  if (auStack_1d0 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0);
  }
  BlockMerkleRoot((uint256 *)local_1f8,(CBlock *)local_a8,(bool *)0x0);
  uStack_74 = (uchar)sStack_1f0.pn.pi_;
  uStack_73 = sStack_1f0.pn.pi_._1_1_;
  uStack_72 = sStack_1f0.pn.pi_._2_1_;
  uStack_71 = sStack_1f0.pn.pi_._3_1_;
  auStack_70[0] = sStack_1f0.pn.pi_._4_1_;
  auStack_70[1] = sStack_1f0.pn.pi_._5_1_;
  auStack_70[2] = sStack_1f0.pn.pi_._6_1_;
  auStack_70[3] = sStack_1f0.pn.pi_._7_1_;
  auStack_70[4] = SUB81(uStack_1e0,0);
  auStack_70[5] = SUB81(uStack_1e0,1);
  auStack_70[6] = SUB81(uStack_1e0,2);
  auStack_70[7] = SUB81(uStack_1e0,3);
  auStack_70[8] = SUB81(uStack_1e0,4);
  auStack_70[9] = SUB81(uStack_1e0,5);
  auStack_70[10] = SUB81(uStack_1e0,6);
  auStack_70[0xb] = SUB81(uStack_1e0,7);
  rStack_84.super_class_property<bool>.value = local_1f8[0];
  uStack_83 = local_1f8[1];
  uStack_82 = local_1f8[2];
  uStack_81 = local_1f8[3];
  uStack_80 = local_1f8[4];
  uStack_7f = local_1f8[5];
  uStack_7e = local_1f8[6];
  uStack_7d = local_1f8[7];
  uStack_7c = (uchar)sStack_1f0.px;
  uStack_7b = sStack_1f0.px._1_1_;
  uStack_7a = sStack_1f0.px._2_1_;
  uStack_79 = sStack_1f0.px._3_1_;
  local_78 = sStack_1f0.px._4_1_;
  uStack_77 = sStack_1f0.px._5_1_;
  uStack_76 = sStack_1f0.px._6_1_;
  uStack_75 = sStack_1f0.px._7_1_;
  local_1d8 = local_1f8;
  auStack_1d0 = (undefined1  [8])sStack_1f0.px;
  asStack_1c8[0].pi_ = sStack_1f0.pn.pi_;
  asStack_1c8[1].pi_ = (sp_counted_base *)uStack_1e0;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x129;
  file_12.m_begin = (iterator)&local_478;
  msg_12.m_end = pvVar17;
  msg_12.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_488,
             msg_12);
  bVar13 = IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_520.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar13;
  local_520.m_message.px = (element_type *)0x0;
  local_520.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_500._0_8_ = "is_not_mutated(block, false)";
  local_500.m_message.px = (element_type *)0xf802f6;
  sStack_1f0.px = (element_type *)(sStack_1f0._1_8_ << 8);
  local_1f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_1f0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_490 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  uStack_1e0 = &local_500;
  boost::test_tools::tt_detail::report_assertion
            (&local_520,(lazy_ostream *)local_1f8,1,0,WARN,_cVar27,(size_t)&local_498,0x129);
  boost::detail::shared_count::~shared_count(&local_520.m_message.pn);
  psVar12 = local_58.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (pointer)CONCAT53(local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                              local_58.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_3_);
  psVar18 = local_58.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar11 !=
      local_58.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var2 = (psVar18->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar11);
    local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_3_ = SUB83(psVar12,0);
    local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._3_5_ = (undefined5)((ulong)psVar12 >> 0x18);
  }
  local_1f8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_1f0,(CTransaction **)local_1f8,
             (allocator<CTransaction> *)&local_520,(CMutableTransaction *)local_1b0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_1f8);
  if (sStack_1f0.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1f0.px);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x130;
  file_13.m_begin = (iterator)&local_4a8;
  msg_13.m_end = pvVar17;
  msg_13.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4b8,
             msg_13);
  bVar13 = CTransaction::IsCoinBase
                     (*(CTransaction **)
                       (CONCAT53(local_58.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._3_5_,
                                 local_58.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_3_) + -0x10));
  local_520.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar13;
  local_520.m_message.px = (element_type *)0x0;
  local_520.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_500._0_8_ = "!block.vtx.back()->IsCoinBase()";
  local_500.m_message.px = (element_type *)0xf805bb;
  sStack_1f0.px = (element_type *)(sStack_1f0._1_8_ << 8);
  local_1f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_1f0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4c0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  uStack_1e0 = &local_500;
  boost::test_tools::tt_detail::report_assertion
            (&local_520,(lazy_ostream *)local_1f8,1,0,WARN,_cVar27,(size_t)&local_4c8,0x130);
  boost::detail::shared_count::~shared_count(&local_520.m_message.pn);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x131;
  file_14.m_begin = (iterator)&local_4d8;
  msg_14.m_end = pvVar17;
  msg_14.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4e8,
             msg_14);
  BlockMerkleRoot((uint256 *)local_1f8,(CBlock *)local_a8,(bool *)0x0);
  auVar23[0] = -((uchar)sStack_1f0.pn.pi_ == asStack_1c8[0].pi_._0_1_);
  auVar23[1] = -(sStack_1f0.pn.pi_._1_1_ == asStack_1c8[0].pi_._1_1_);
  auVar23[2] = -(sStack_1f0.pn.pi_._2_1_ == asStack_1c8[0].pi_._2_1_);
  auVar23[3] = -(sStack_1f0.pn.pi_._3_1_ == asStack_1c8[0].pi_._3_1_);
  auVar23[4] = -(sStack_1f0.pn.pi_._4_1_ == asStack_1c8[0].pi_._4_1_);
  auVar23[5] = -(sStack_1f0.pn.pi_._5_1_ == asStack_1c8[0].pi_._5_1_);
  auVar23[6] = -(sStack_1f0.pn.pi_._6_1_ == asStack_1c8[0].pi_._6_1_);
  auVar23[7] = -(sStack_1f0.pn.pi_._7_1_ == asStack_1c8[0].pi_._7_1_);
  auVar23[8] = -((uchar)uStack_1e0 == asStack_1c8[1].pi_._0_1_);
  auVar23[9] = -(uStack_1e0._1_1_ == asStack_1c8[1].pi_._1_1_);
  auVar23[10] = -(uStack_1e0._2_1_ == asStack_1c8[1].pi_._2_1_);
  auVar23[0xb] = -(uStack_1e0._3_1_ == asStack_1c8[1].pi_._3_1_);
  auVar23[0xc] = -(uStack_1e0._4_1_ == asStack_1c8[1].pi_._4_1_);
  auVar23[0xd] = -(uStack_1e0._5_1_ == asStack_1c8[1].pi_._5_1_);
  auVar23[0xe] = -(uStack_1e0._6_1_ == asStack_1c8[1].pi_._6_1_);
  auVar23[0xf] = -(uStack_1e0._7_1_ == asStack_1c8[1].pi_._7_1_);
  auVar20[0] = -((readonly_property<bool>)local_1f8[0] == local_1d8[0]);
  auVar20[1] = -(local_1f8[1] == local_1d8[1]);
  auVar20[2] = -(local_1f8[2] == local_1d8[2]);
  auVar20[3] = -(local_1f8[3] == local_1d8[3]);
  auVar20[4] = -(local_1f8[4] == local_1d8[4]);
  auVar20[5] = -(local_1f8[5] == local_1d8[5]);
  auVar20[6] = -(local_1f8[6] == local_1d8[6]);
  auVar20[7] = -(local_1f8[7] == local_1d8[7]);
  auVar20[8] = -(sStack_1f0.px._0_1_ == (bool)auStack_1d0[0]);
  auVar20[9] = -(sStack_1f0.px._1_1_ == auStack_1d0[1]);
  auVar20[10] = -(sStack_1f0.px._2_1_ == auStack_1d0[2]);
  auVar20[0xb] = -(sStack_1f0.px._3_1_ == auStack_1d0[3]);
  auVar20[0xc] = -(sStack_1f0.px._4_1_ == auStack_1d0[4]);
  auVar20[0xd] = -(sStack_1f0.px._5_1_ == auStack_1d0[5]);
  auVar20[0xe] = -(sStack_1f0.px._6_1_ == auStack_1d0[6]);
  auVar20[0xf] = -(sStack_1f0.px._7_1_ == auStack_1d0[7]);
  auVar20 = auVar20 & auVar23;
  local_500.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
  local_500.m_message.px = (element_type *)0x0;
  local_500.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_508 = &local_530;
  local_530 = "BlockMerkleRoot(block) == merkle_root";
  local_528 = "";
  local_520.m_message.px = (element_type *)(local_520.m_message._1_8_ << 8);
  local_520._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_520.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_538 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_500,(lazy_ostream *)&local_520,1,0,WARN,_cVar27,(size_t)&local_540,0x131);
  boost::detail::shared_count::~shared_count(&local_500.m_message.pn);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x132;
  file_15.m_begin = (iterator)&local_550;
  msg_15.m_end = pvVar17;
  msg_15.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_560,
             msg_15);
  rVar14.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_520.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar14.super_readonly_property<bool>.super_class_property<bool>.value;
  local_520.m_message.px = (element_type *)0x0;
  local_520.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_500._0_8_ = "is_mutated(block, false)";
  local_500.m_message.px = (element_type *)0xf802d9;
  sStack_1f0.px = (element_type *)(sStack_1f0._1_8_ << 8);
  local_1f8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_1f0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_568 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  uStack_1e0 = &local_500;
  boost::test_tools::tt_detail::report_assertion
            (&local_520,(lazy_ostream *)local_1f8,1,0,WARN,_cVar27,(size_t)&local_570,0x132);
  boost::detail::shared_count::~shared_count(&local_520.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_58);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_198);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1b0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110);
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._5_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._6_1_ = '\0';
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = '\0';
  auStack_70[8] = '\0';
  auStack_70[9] = '\0';
  auStack_70[10] = '\0';
  auStack_70[0xb] = '\0';
  auStack_70._12_12_ = SUB1612((undefined1  [16])0x0,4);
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  auStack_70[0] = '\0';
  auStack_70[1] = '\0';
  auStack_70[2] = '\0';
  auStack_70[3] = '\0';
  auStack_70[4] = '\0';
  auStack_70[5] = '\0';
  auStack_70[6] = '\0';
  auStack_70[7] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  rStack_84.super_class_property<bool>.value = (class_property<bool>)false;
  uStack_83 = '\0';
  uStack_82 = '\0';
  uStack_81 = '\0';
  uStack_80 = '\0';
  uStack_7f = '\0';
  uStack_7e = '\0';
  uStack_7d = '\0';
  uStack_7c = '\0';
  uStack_7b = '\0';
  uStack_7a = '\0';
  uStack_79 = '\0';
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  local_a8 = (undefined1  [16])0x0;
  test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_110,true);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_110);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT17(uStack_101,
                    CONCAT16(uStack_102,
                             CONCAT15(uStack_103,
                                      CONCAT14(uStack_104,
                                               CONCAT13(uStack_105,
                                                        CONCAT12(uStack_106,
                                                                 CONCAT11(uStack_107,bStack_108)))))
                            ));
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_110);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110,1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)((((Txid *)((long)local_110 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems
              + 0x17),1);
  local_178[0] = (class_property<bool>)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            (*(vector<unsigned_char,std::allocator<unsigned_char>> **)
              ((((Txid *)((long)local_110 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems
              + 0x17),local_178);
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_170,(CTransaction **)local_178,
             (allocator<CTransaction> *)local_1b0,(CMutableTransaction *)local_110);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&local_58,(shared_ptr<const_CTransaction> *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(abStack_170._1_7_,abStack_170[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(abStack_170._1_7_,abStack_170[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110);
  BlockMerkleRoot((uint256 *)local_110,(CBlock *)local_a8,(bool *)0x0);
  uStack_74 = (uchar)local_100;
  uStack_73 = (uchar)((ulong)local_100 >> 8);
  uStack_72 = (uchar)((ulong)local_100 >> 0x10);
  uStack_71 = (uchar)((ulong)local_100 >> 0x18);
  auStack_70[0] = (undefined1)((ulong)local_100 >> 0x20);
  auStack_70[1] = (undefined1)((ulong)local_100 >> 0x28);
  auStack_70[2] = (undefined1)((ulong)local_100 >> 0x30);
  auStack_70[3] = (undefined1)((ulong)local_100 >> 0x38);
  auStack_70[4] =
       SUB81(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = local_110[0];
  uStack_83 = local_110[1];
  uStack_82 = local_110[2];
  uStack_81 = local_110[3];
  uStack_80 = local_110[4];
  uStack_7f = local_110[5];
  uStack_7e = local_110[6];
  uStack_7d = local_110[7];
  uStack_7c = bStack_108;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x142;
  file_16.m_begin = (iterator)&local_580;
  msg_16.m_end = pvVar17;
  msg_16.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_590,
             msg_16);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,false);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, false)";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_598 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_5a0,0x142);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x144;
  file_17.m_begin = (iterator)&local_5b0;
  msg_17.m_end = pvVar17;
  msg_17.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5c0,
             msg_17);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,true);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, true)";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5c8 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar27,
             (size_t)&local_5d0,0x144);
  boost::detail::shared_count::~shared_count(&sStack_168);
  pCVar15 = (CBlock *)local_a8;
  BlockWitnessMerkleRoot((uint256 *)local_110,pCVar15,(bool *)0x0);
  _cVar28 = CONCAT17(uStack_101,
                     CONCAT16(uStack_102,
                              CONCAT15(uStack_103,
                                       CONCAT14(uStack_104,
                                                CONCAT13(uStack_105,
                                                         CONCAT12(uStack_106,
                                                                  CONCAT11(uStack_107,bStack_108))))
                                      )));
  commitment.super_base_blob<256U>.m_data._M_elems[8] = bStack_108;
  commitment.super_base_blob<256U>.m_data._M_elems[9] = uStack_107;
  commitment.super_base_blob<256U>.m_data._M_elems[10] = uStack_106;
  commitment.super_base_blob<256U>.m_data._M_elems[0xb] = uStack_105;
  commitment.super_base_blob<256U>.m_data._M_elems[0] = (uchar)local_110[0];
  commitment.super_base_blob<256U>.m_data._M_elems[1] = local_110[1];
  commitment.super_base_blob<256U>.m_data._M_elems[2] = local_110[2];
  commitment.super_base_blob<256U>.m_data._M_elems[3] = local_110[3];
  commitment.super_base_blob<256U>.m_data._M_elems[4] = local_110[4];
  commitment.super_base_blob<256U>.m_data._M_elems[5] = local_110[5];
  commitment.super_base_blob<256U>.m_data._M_elems[6] = local_110[6];
  commitment.super_base_blob<256U>.m_data._M_elems[7] = local_110[7];
  commitment.super_base_blob<256U>.m_data._M_elems._16_8_ = local_100;
  commitment.super_base_blob<256U>.m_data._M_elems._24_8_ =
       avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  test_method::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_a8,pCVar15,commitment);
  BlockMerkleRoot((uint256 *)local_178,(CBlock *)local_a8,(bool *)0x0);
  uStack_74 = (uchar)sStack_168.pi_;
  uStack_73 = (uchar)((ulong)sStack_168.pi_ >> 8);
  uStack_72 = (uchar)((ulong)sStack_168.pi_ >> 0x10);
  uStack_71 = (uchar)((ulong)sStack_168.pi_ >> 0x18);
  auStack_70[0] = (undefined1)((ulong)sStack_168.pi_ >> 0x20);
  auStack_70[1] = (undefined1)((ulong)sStack_168.pi_ >> 0x28);
  auStack_70[2] = (undefined1)((ulong)sStack_168.pi_ >> 0x30);
  auStack_70[3] = (undefined1)((ulong)sStack_168.pi_ >> 0x38);
  auStack_70[4] =
       SUB81(avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = local_178[0];
  uStack_83 = (uchar)local_178._1_7_;
  uStack_82 = SUB71(local_178._1_7_,1);
  uStack_81 = SUB71(local_178._1_7_,2);
  uStack_80 = SUB71(local_178._1_7_,3);
  uStack_7f = SUB71(local_178._1_7_,4);
  uStack_7e = SUB71(local_178._1_7_,5);
  uStack_7d = SUB71(local_178._1_7_,6);
  uStack_7c = abStack_170[0];
  uStack_7b = (uchar)abStack_170._1_7_;
  uStack_7a = SUB71(abStack_170._1_7_,1);
  uStack_79 = SUB71(abStack_170._1_7_,2);
  local_78 = SUB71(abStack_170._1_7_,3);
  uStack_77 = SUB71(abStack_170._1_7_,4);
  uStack_76 = SUB71(abStack_170._1_7_,5);
  uStack_75 = SUB71(abStack_170._1_7_,6);
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x14c;
  file_18.m_begin = (iterator)&local_5e0;
  msg_18.m_end = pvVar17;
  msg_18.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5f0,
             msg_18);
  bVar13 = IsBlockMutated((CBlock *)local_a8,true);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_178[0] = (class_property<bool>)!bVar13;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_not_mutated(block, true)";
  local_1b0._8_8_ = (element_type *)0xf80615;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_5f8 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar28,
             (size_t)&local_600,0x14c);
  boost::detail::shared_count::~shared_count(&sStack_168);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)local_110,
             local_58.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  puVar4 = *(undefined8 **)
            ((((Txid *)((long)local_110 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems +
            0x17);
  pcVar5 = (char *)*puVar4;
  if (pcVar5 == (char *)puVar4[1]) {
    __assert_fail("!mtx.vin[0].scriptWitness.stack[0].empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0x151,"void validation_tests::block_malleation::test_method()");
  }
  *pcVar5 = *pcVar5 + '\x01';
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_170,(CTransaction **)local_178,
             (allocator<CTransaction> *)local_1b0,(CMutableTransaction *)local_110);
  peVar1 = (element_type *)CONCAT71(local_178._1_7_,local_178[0]);
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT71(abStack_170._1_7_,abStack_170[0]);
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  p_Var2 = local_58.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_58.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(abStack_170._1_7_,abStack_170[0])
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(abStack_170._1_7_,abStack_170[0]));
    }
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x157;
  file_19.m_begin = (iterator)&local_610;
  msg_19.m_end = pvVar17;
  msg_19.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_620,
             msg_19);
  BlockMerkleRoot((uint256 *)local_110,(CBlock *)local_a8,(bool *)0x0);
  auVar26[0] = -((class_property<bool>)local_110[0] == rStack_84.super_class_property<bool>.value);
  auVar26[1] = -(local_110[1] == uStack_83);
  auVar26[2] = -(local_110[2] == uStack_82);
  auVar26[3] = -(local_110[3] == uStack_81);
  auVar26[4] = -(local_110[4] == uStack_80);
  auVar26[5] = -(local_110[5] == uStack_7f);
  auVar26[6] = -(local_110[6] == uStack_7e);
  auVar26[7] = -(local_110[7] == uStack_7d);
  auVar26[8] = -(bStack_108 == (bool)uStack_7c);
  auVar26[9] = -(uStack_107 == uStack_7b);
  auVar26[10] = -(uStack_106 == uStack_7a);
  auVar26[0xb] = -(uStack_105 == uStack_79);
  auVar26[0xc] = -(uStack_104 == local_78);
  auVar26[0xd] = -(uStack_103 == uStack_77);
  auVar26[0xe] = -(uStack_102 == uStack_76);
  auVar26[0xf] = -(uStack_101 == uStack_75);
  auVar21[0] = -((uchar)local_100 == uStack_74);
  auVar21[1] = -(local_100._1_1_ == uStack_73);
  auVar21[2] = -(local_100._2_1_ == uStack_72);
  auVar21[3] = -(local_100._3_1_ == uStack_71);
  auVar21[4] = -(local_100._4_1_ == auStack_70[0]);
  auVar21[5] = -(local_100._5_1_ == auStack_70[1]);
  auVar21[6] = -(local_100._6_1_ == auStack_70[2]);
  auVar21[7] = -(local_100._7_1_ == auStack_70[3]);
  auVar21[8] = -((uchar)avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start == auStack_70[4]);
  auVar21[9] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start._1_1_ == auStack_70[5]);
  auVar21[10] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start._2_1_ == auStack_70[6]);
  auVar21[0xb] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._3_1_ == auStack_70[7]);
  auVar21[0xc] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_1_ == auStack_70[8]);
  auVar21[0xd] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._5_1_ == auStack_70[9]);
  auVar21[0xe] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._6_1_ == auStack_70[10]);
  auVar21[0xf] = -(avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._7_1_ == auStack_70[0xb]);
  auVar21 = auVar21 & auVar26;
  local_1b0[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
  local_1b0._8_8_ = (element_type *)0x0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = (undefined1  [8])0xf80641;
  auStack_1d0 = (undefined1  [8])(element_type *)0xf8066f;
  abStack_170[0] = false;
  local_178[0] = (class_property<bool>)0xc8;
  local_178._1_7_ = 0x13ae1;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1d8;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_628 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)local_178,1,0,WARN,_cVar28,
             (size_t)&local_630,0x157);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x158;
  file_20.m_begin = (iterator)&local_640;
  msg_20.m_end = pvVar17;
  msg_20.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_650,
             msg_20);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,true);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, true)";
  local_1b0._8_8_ = "";
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_658 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar28,
             (size_t)&local_660,0x158);
  boost::detail::shared_count::~shared_count(&sStack_168);
  pCVar15 = (CBlock *)local_a8;
  BlockWitnessMerkleRoot((uint256 *)local_110,pCVar15,(bool *)0x0);
  _cVar28 = CONCAT17(uStack_101,
                     CONCAT16(uStack_102,
                              CONCAT15(uStack_103,
                                       CONCAT14(uStack_104,
                                                CONCAT13(uStack_105,
                                                         CONCAT12(uStack_106,
                                                                  CONCAT11(uStack_107,bStack_108))))
                                      )));
  commitment_00.super_base_blob<256U>.m_data._M_elems[8] = bStack_108;
  commitment_00.super_base_blob<256U>.m_data._M_elems[9] = uStack_107;
  commitment_00.super_base_blob<256U>.m_data._M_elems[10] = uStack_106;
  commitment_00.super_base_blob<256U>.m_data._M_elems[0xb] = uStack_105;
  commitment_00.super_base_blob<256U>.m_data._M_elems[0] = (uchar)local_110[0];
  commitment_00.super_base_blob<256U>.m_data._M_elems[1] = local_110[1];
  commitment_00.super_base_blob<256U>.m_data._M_elems[2] = local_110[2];
  commitment_00.super_base_blob<256U>.m_data._M_elems[3] = local_110[3];
  commitment_00.super_base_blob<256U>.m_data._M_elems[4] = local_110[4];
  commitment_00.super_base_blob<256U>.m_data._M_elems[5] = local_110[5];
  commitment_00.super_base_blob<256U>.m_data._M_elems[6] = local_110[6];
  commitment_00.super_base_blob<256U>.m_data._M_elems[7] = local_110[7];
  commitment_00.super_base_blob<256U>.m_data._M_elems._16_8_ = local_100;
  commitment_00.super_base_blob<256U>.m_data._M_elems._24_8_ =
       avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  test_method::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_a8,pCVar15,commitment_00);
  BlockMerkleRoot((uint256 *)local_178,(CBlock *)local_a8,(bool *)0x0);
  uStack_74 = (uchar)sStack_168.pi_;
  uStack_73 = (uchar)((ulong)sStack_168.pi_ >> 8);
  uStack_72 = (uchar)((ulong)sStack_168.pi_ >> 0x10);
  uStack_71 = (uchar)((ulong)sStack_168.pi_ >> 0x18);
  auStack_70[0] = (undefined1)((ulong)sStack_168.pi_ >> 0x20);
  auStack_70[1] = (undefined1)((ulong)sStack_168.pi_ >> 0x28);
  auStack_70[2] = (undefined1)((ulong)sStack_168.pi_ >> 0x30);
  auStack_70[3] = (undefined1)((ulong)sStack_168.pi_ >> 0x38);
  auStack_70[4] =
       SUB81(avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = local_178[0];
  uStack_83 = (uchar)local_178._1_7_;
  uStack_82 = SUB71(local_178._1_7_,1);
  uStack_81 = SUB71(local_178._1_7_,2);
  uStack_80 = SUB71(local_178._1_7_,3);
  uStack_7f = SUB71(local_178._1_7_,4);
  uStack_7e = SUB71(local_178._1_7_,5);
  uStack_7d = SUB71(local_178._1_7_,6);
  uStack_7c = abStack_170[0];
  uStack_7b = (uchar)abStack_170._1_7_;
  uStack_7a = SUB71(abStack_170._1_7_,1);
  uStack_79 = SUB71(abStack_170._1_7_,2);
  local_78 = SUB71(abStack_170._1_7_,3);
  uStack_77 = SUB71(abStack_170._1_7_,4);
  uStack_76 = SUB71(abStack_170._1_7_,5);
  uStack_75 = SUB71(abStack_170._1_7_,6);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x15e;
  file_21.m_begin = (iterator)&local_670;
  msg_21.m_end = pvVar17;
  msg_21.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_680,
             msg_21);
  bVar13 = IsBlockMutated((CBlock *)local_a8,true);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  local_178[0] = (class_property<bool>)!bVar13;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_not_mutated(block, true)";
  local_1b0._8_8_ = (element_type *)0xf80615;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_688 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar28,
             (size_t)&local_690,0x15e);
  boost::detail::shared_count::~shared_count(&sStack_168);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)local_110,
             ((local_58.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)((((Txid *)((long)local_110 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems
              + 0x17),0);
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_170,(CTransaction **)local_178,
             (allocator<CTransaction> *)local_1b0,(CMutableTransaction *)local_110);
  peVar1 = (element_type *)CONCAT71(local_178._1_7_,local_178[0]);
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT71(abStack_170._1_7_,abStack_170[0]);
  local_178[0] = (class_property<bool>)0x0;
  local_178._1_7_ = 0;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  p_Var2 = ((local_58.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  ((local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
  ((local_58.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(abStack_170._1_7_,abStack_170[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(abStack_170._1_7_,abStack_170[0]));
  }
  BlockMerkleRoot((uint256 *)local_178,(CBlock *)local_a8,(bool *)0x0);
  uStack_74 = (uchar)sStack_168.pi_;
  uStack_73 = (uchar)((ulong)sStack_168.pi_ >> 8);
  uStack_72 = (uchar)((ulong)sStack_168.pi_ >> 0x10);
  uStack_71 = (uchar)((ulong)sStack_168.pi_ >> 0x18);
  auStack_70[0] = (undefined1)((ulong)sStack_168.pi_ >> 0x20);
  auStack_70[1] = (undefined1)((ulong)sStack_168.pi_ >> 0x28);
  auStack_70[2] = (undefined1)((ulong)sStack_168.pi_ >> 0x30);
  auStack_70[3] = (undefined1)((ulong)sStack_168.pi_ >> 0x38);
  auStack_70[4] =
       SUB81(avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  auStack_70[5] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 8);
  auStack_70[6] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x10);
  auStack_70[7] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x18);
  auStack_70[8] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  auStack_70[9] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x28);
  auStack_70[10] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x30);
  auStack_70[0xb] =
       (undefined1)
       ((ulong)avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x38);
  rStack_84.super_class_property<bool>.value = local_178[0];
  uStack_83 = (uchar)local_178._1_7_;
  uStack_82 = SUB71(local_178._1_7_,1);
  uStack_81 = SUB71(local_178._1_7_,2);
  uStack_80 = SUB71(local_178._1_7_,3);
  uStack_7f = SUB71(local_178._1_7_,4);
  uStack_7e = SUB71(local_178._1_7_,5);
  uStack_7d = SUB71(local_178._1_7_,6);
  uStack_7c = abStack_170[0];
  uStack_7b = (uchar)abStack_170._1_7_;
  uStack_7a = SUB71(abStack_170._1_7_,1);
  uStack_79 = SUB71(abStack_170._1_7_,2);
  local_78 = SUB71(abStack_170._1_7_,3);
  uStack_77 = SUB71(abStack_170._1_7_,4);
  uStack_76 = SUB71(abStack_170._1_7_,5);
  uStack_75 = SUB71(abStack_170._1_7_,6);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_110);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x167;
  file_22.m_begin = (iterator)&local_6a0;
  msg_22.m_end = pvVar17;
  msg_22.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_6b0,
             msg_22);
  local_178[0] = (class_property<bool>)IsBlockMutated((CBlock *)local_a8,true);
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  bStack_3e = false;
  abStack_170[0] = false;
  abStack_170[1] = false;
  abStack_170[2] = false;
  abStack_170[3] = false;
  abStack_170[4] = false;
  abStack_170[5] = false;
  abStack_170[6] = false;
  abStack_170[7] = false;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "is_mutated(block, true)";
  local_1b0._8_8_ = (element_type *)0xf805f9;
  bStack_108 = false;
  local_110 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_6b8 = "";
  avStack_f8[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_110,1,0,WARN,_cVar28,
             (size_t)&local_6c0,0x167);
  boost::detail::shared_count::~shared_count(&sStack_168);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(block_malleation)
{
    // Test utilities that calls `IsBlockMutated` and then clears the validity
    // cache flags on `CBlock`.
    auto is_mutated = [](CBlock& block, bool check_witness_root) {
        bool mutated{IsBlockMutated(block, check_witness_root)};
        block.fChecked = false;
        block.m_checked_witness_commitment = false;
        block.m_checked_merkle_root = false;
        return mutated;
    };
    auto is_not_mutated = [&is_mutated](CBlock& block, bool check_witness_root) {
        return !is_mutated(block, check_witness_root);
    };

    // Test utilities to create coinbase transactions and insert witness
    // commitments.
    //
    // Note: this will not include the witness stack by default to avoid
    // triggering the "no witnesses allowed for blocks that don't commit to
    // witnesses" rule when testing other malleation vectors.
    auto create_coinbase_tx = [](bool include_witness = false) {
        CMutableTransaction coinbase;
        coinbase.vin.resize(1);
        if (include_witness) {
            coinbase.vin[0].scriptWitness.stack.resize(1);
            coinbase.vin[0].scriptWitness.stack[0] = std::vector<unsigned char>(32, 0x00);
        }

        coinbase.vout.resize(1);
        coinbase.vout[0].scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
        coinbase.vout[0].scriptPubKey[0] = OP_RETURN;
        coinbase.vout[0].scriptPubKey[1] = 0x24;
        coinbase.vout[0].scriptPubKey[2] = 0xaa;
        coinbase.vout[0].scriptPubKey[3] = 0x21;
        coinbase.vout[0].scriptPubKey[4] = 0xa9;
        coinbase.vout[0].scriptPubKey[5] = 0xed;

        auto tx = MakeTransactionRef(coinbase);
        assert(tx->IsCoinBase());
        return tx;
    };
    auto insert_witness_commitment = [](CBlock& block, uint256 commitment) {
        assert(!block.vtx.empty() && block.vtx[0]->IsCoinBase() && !block.vtx[0]->vout.empty());

        CMutableTransaction mtx{*block.vtx[0]};
        CHash256().Write(commitment).Write(std::vector<unsigned char>(32, 0x00)).Finalize(commitment);
        memcpy(&mtx.vout[0].scriptPubKey[6], commitment.begin(), 32);
        block.vtx[0] = MakeTransactionRef(mtx);
    };

    {
        CBlock block;

        // Empty block is expected to have merkle root of 0x0.
        BOOST_CHECK(block.vtx.empty());
        block.hashMerkleRoot = uint256{1};
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        block.hashMerkleRoot = uint256{};
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with a single coinbase tx is mutated if the merkle root is not
        // equal to the coinbase tx's hash.
        block.vtx.push_back(create_coinbase_tx());
        BOOST_CHECK(block.vtx[0]->GetHash() != block.hashMerkleRoot);
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        block.hashMerkleRoot = block.vtx[0]->GetHash();
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with two transactions is mutated if the merkle root does not
        // match the double sha256 of the concatenation of the two transaction
        // hashes.
        block.vtx.push_back(MakeTransactionRef(CMutableTransaction{}));
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        HashWriter hasher;
        hasher.write(block.vtx[0]->GetHash());
        hasher.write(block.vtx[1]->GetHash());
        block.hashMerkleRoot = hasher.GetHash();
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with two transactions is mutated if any node is duplicate.
        {
            block.vtx[1] = block.vtx[0];
            HashWriter hasher;
            hasher.write(block.vtx[0]->GetHash());
            hasher.write(block.vtx[1]->GetHash());
            block.hashMerkleRoot = hasher.GetHash();
            BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        }

        // Blocks with 64-byte coinbase transactions are not considered mutated
        block.vtx.clear();
        {
            CMutableTransaction mtx;
            mtx.vin.resize(1);
            mtx.vout.resize(1);
            mtx.vout[0].scriptPubKey.resize(4);
            block.vtx.push_back(MakeTransactionRef(mtx));
            block.hashMerkleRoot = block.vtx.back()->GetHash();
            assert(block.vtx.back()->IsCoinBase());
            assert(GetSerializeSize(TX_NO_WITNESS(block.vtx.back())) == 64);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));
    }

    {
        // Test merkle root malleation

        // Pseudo code to mine transactions tx{1,2,3}:
        //
        // ```
        // loop {
        //   tx1 = random_tx()
        //   tx2 = random_tx()
        //   tx3 = deserialize_tx(txid(tx1) || txid(tx2));
        //   if serialized_size_without_witness(tx3) == 64 {
        //     print(hex(tx3))
        //     break
        //   }
        // }
        // ```
        //
        // The `random_tx` function used to mine the txs below simply created
        // empty transactions with a random version field.
        CMutableTransaction tx1;
        BOOST_CHECK(DecodeHexTx(tx1, "ff204bd0000000000000", /*try_no_witness=*/true, /*try_witness=*/false));
        CMutableTransaction tx2;
        BOOST_CHECK(DecodeHexTx(tx2, "8ae53c92000000000000", /*try_no_witness=*/true, /*try_witness=*/false));
        CMutableTransaction tx3;
        BOOST_CHECK(DecodeHexTx(tx3, "cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06", /*try_no_witness=*/true, /*try_witness=*/false));
        {
            // Verify that double_sha256(txid1||txid2) == txid3
            HashWriter hasher;
            hasher.write(tx1.GetHash());
            hasher.write(tx2.GetHash());
            assert(hasher.GetHash() == tx3.GetHash());
            // Verify that tx3 is 64 bytes in size (without witness).
            assert(GetSerializeSize(TX_NO_WITNESS(tx3)) == 64);
        }

        CBlock block;
        block.vtx.push_back(MakeTransactionRef(tx1));
        block.vtx.push_back(MakeTransactionRef(tx2));
        uint256 merkle_root = block.hashMerkleRoot = BlockMerkleRoot(block);
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Mutate the block by replacing the two transactions with one 64-byte
        // transaction that serializes into the concatenation of the txids of
        // the transactions in the unmutated block.
        block.vtx.clear();
        block.vtx.push_back(MakeTransactionRef(tx3));
        BOOST_CHECK(!block.vtx.back()->IsCoinBase());
        BOOST_CHECK(BlockMerkleRoot(block) == merkle_root);
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
    }

    {
        CBlock block;
        block.vtx.push_back(create_coinbase_tx(/*include_witness=*/true));
        {
            CMutableTransaction mtx;
            mtx.vin.resize(1);
            mtx.vin[0].scriptWitness.stack.resize(1);
            mtx.vin[0].scriptWitness.stack[0] = {0};
            block.vtx.push_back(MakeTransactionRef(mtx));
        }
        block.hashMerkleRoot = BlockMerkleRoot(block);
        // Block with witnesses is considered mutated if the witness commitment
        // is not validated.
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        // Block with invalid witness commitment is considered mutated.
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));

        // Block with valid commitment is not mutated
        {
            auto commitment{BlockWitnessMerkleRoot(block)};
            insert_witness_commitment(block, commitment);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/true));

        // Malleating witnesses should be caught by `IsBlockMutated`.
        {
            CMutableTransaction mtx{*block.vtx[1]};
            assert(!mtx.vin[0].scriptWitness.stack[0].empty());
            ++mtx.vin[0].scriptWitness.stack[0][0];
            block.vtx[1] = MakeTransactionRef(mtx);
        }
        // Without also updating the witness commitment, the merkle root should
        // not change when changing one of the witnesses.
        BOOST_CHECK(block.hashMerkleRoot == BlockMerkleRoot(block));
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));
        {
            auto commitment{BlockWitnessMerkleRoot(block)};
            insert_witness_commitment(block, commitment);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/true));

        // Test malleating the coinbase witness reserved value
        {
            CMutableTransaction mtx{*block.vtx[0]};
            mtx.vin[0].scriptWitness.stack.resize(0);
            block.vtx[0] = MakeTransactionRef(mtx);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));
    }
}